

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

quad_value_bit_vector * __thiscall
bsim::quad_value_bit_vector::operator=(quad_value_bit_vector *this,quad_value_bit_vector *other)

{
  int iVar1;
  const_reference pvVar2;
  reference pvVar3;
  quad_value_bit_vector *in_RSI;
  quad_value_bit_vector *in_RDI;
  int i;
  int local_1c;
  quad_value_bit_vector *this_00;
  
  if (in_RSI != in_RDI) {
    this_00 = in_RDI;
    std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::size(&in_RSI->bits);
    std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize
              (&this_00->bits,(size_type)in_RSI);
    iVar1 = bitLength(in_RSI);
    in_RDI->N = iVar1;
    for (local_1c = 0; iVar1 = bitLength(in_RSI), local_1c < iVar1; local_1c = local_1c + 1) {
      pvVar2 = std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::operator[]
                         (&in_RSI->bits,(long)local_1c);
      pvVar3 = std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::operator[]
                         (&in_RDI->bits,(long)local_1c);
      pvVar3->value = pvVar2->value;
    }
  }
  return in_RDI;
}

Assistant:

quad_value_bit_vector& operator=(const quad_value_bit_vector& other) {
      if (&other == this) {
    	return *this;
      }

      bits.resize(other.bits.size());

      N = other.bitLength();

      for (int i = 0; i < other.bitLength(); i++) {
        bits[i] = other.bits[i];
      }

      return *this;
    }